

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::OptDst(GlobOpt *this,Instr **pInstr,Value *dstVal,Value *src1Val,Value *src2Val,
               Value *dstIndirIndexVal,Value *src1IndirIndexVal)

{
  OpCode OVar1;
  SymOpnd *this_00;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  BOOLEAN BVar5;
  BailOutKind BVar6;
  undefined4 *puVar7;
  PropertySymOpnd *opnd;
  RegOpnd *pRVar8;
  StackSym *pSVar9;
  RegOpnd *this_01;
  GlobOpt *this_02;
  Value *pVVar10;
  Instr *pIVar11;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  Region *pRVar12;
  RegionType RVar13;
  Opnd *this_03;
  BailOutKind bailOutKind;
  long lVar14;
  GlobOpt *this_04;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  Value *pVStack_48;
  ValueType baseValueType;
  undefined7 extraout_var_02;
  
  this_00 = (SymOpnd *)(*pInstr)->m_dst;
  pVStack_48 = dstVal;
  if (this_00 == (SymOpnd *)0x0) {
    ProcessKills(this,*pInstr);
    goto LAB_0044c67c;
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
  if (OVar3 == OpndKindSym) {
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar4) goto LAB_0044c7b8;
      *puVar7 = 0;
    }
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (bVar4) {
      pIVar11 = *pInstr;
      opnd = IR::Opnd::AsPropertySymOpnd((Opnd *)this_00);
      FinishOptPropOp(this,pIVar11,opnd,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
    }
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
  if ((OVar3 == OpndKindIndir) && (this->prePassLoop == (Loop *)0x0)) {
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar4) goto LAB_0044c7b8;
      *puVar7 = 0;
    }
    local_4a = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&this_00->m_sym->m_next;
    bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_4a.field_0);
    if ((bVar4) && (pIVar11 = *pInstr, pIVar11->m_src1->m_type == TyVar)) {
      if (pIVar11->m_opcode == StElemC) {
        bVar4 = ValueType::IsLikelyNativeArray((ValueType *)&local_4a.field_0);
        if (!bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xbf2,"(baseValueType.IsLikelyNativeArray())",
                             "baseValueType.IsLikelyNativeArray()");
          if (!bVar4) goto LAB_0044c7b8;
          *puVar7 = 0;
        }
        if (((*pInstr)->field_0x38 & 0x10) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xbf3,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
          if (!bVar4) goto LAB_0044c7b8;
          *puVar7 = 0;
        }
        GenerateBailAtOperation(this,pInstr,BailOutConventionalNativeArrayAccessOnly);
      }
      else if ((pIVar11->field_0x38 & 0x10) != 0) {
        BVar6 = IR::Instr::GetBailOutKind(pIVar11);
        bailOutKind = BVar6 - BailOutOnArrayAccessHelperCall;
        if ((BVar6 >> 0x11 & 1) == 0) {
          bailOutKind = BVar6;
        }
        if ((bailOutKind == BailOutInvalid) || (bailOutKind == BailOutOnImplicitCallsPreOp)) {
          IR::Instr::ClearBailOutInfo(*pInstr);
        }
        else {
          IR::Instr::SetBailOutKind(*pInstr,bailOutKind);
        }
      }
    }
  }
  ProcessKills(this,*pInstr);
  if (pVStack_48 == (Value *)0x0) {
    pVStack_48 = ValueNumberDst(this,pInstr,src1Val,src2Val);
  }
  if (this->prePassLoop == (Loop *)0x0) {
    if (((pVStack_48 != (Value *)0x0) &&
        (IR::Opnd::SetValueType
                   ((Opnd *)this_00,
                    (ValueType)
                    *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                     &(pVStack_48->valueInfo->super_ValueType).field_0.field_0),
        this->currentBlock->loop != (Loop *)0x0)) && (this->prePassLoop == (Loop *)0x0)) {
      OVar1 = (*pInstr)->m_opcode;
      if (((OVar1 == Ld_I4) || (OVar1 == Ld_A)) &&
         ((OVar3 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar3 == OpndKindReg &&
          (bVar4 = Func::IsJitInDebugMode(this->func), !bVar4)))) {
        pRVar8 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
        pSVar9 = pRVar8->m_sym;
        if (((pSVar9->field_0x1a & 1) != 0) &&
           (pSVar9 = StackSym::GetVarEquivSym(pSVar9,(Func *)0x0), pSVar9 == (StackSym *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0xc3e,"(srcVarSym)","srcVarSym");
          if (!bVar4) goto LAB_0044c7b8;
          *puVar7 = 0;
          pSVar9 = (StackSym *)0x0;
        }
        if ((StackSym *)pVStack_48->valueInfo->symStore == pSVar9) {
          this_01 = IR::Opnd::AsRegOpnd((Opnd *)this_00);
          this_02 = (GlobOpt *)this_01->m_sym;
          if (((ulong)this_02->intConstantToValueMap & 0x10000) != 0) {
            lVar14 = 0;
            this_04 = this_02;
            this_02 = (GlobOpt *)StackSym::GetVarEquivSym((StackSym *)this_02,(Func *)0x0);
            if (this_02 == (GlobOpt *)0x0) {
              OptDst();
              RVar13 = this_04->currentRegion->type;
              pRVar12 = (Region *)(ulong)RVar13;
              if ((RVar13 == RegionTypeFinally) || (RVar13 == RegionTypeTry)) {
                OVar3 = IR::Opnd::GetKind(this_03);
                if (OVar3 != OpndKindReg) {
                  return (Value *)CONCAT71(extraout_var,OVar3);
                }
                OVar3 = IR::Opnd::GetKind(this_03);
                if (OVar3 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                  *puVar7 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar4) goto LAB_0044c966;
                  *puVar7 = 0;
                }
                if (((ulong)((Value *)this_03[1]._vptr_Opnd)[1].valueInfo & 0x2000) == 0) {
                  return (Value *)this_03[1]._vptr_Opnd;
                }
                OVar3 = IR::Opnd::GetKind(this_03);
                pVVar10 = (Value *)CONCAT71(extraout_var_00,OVar3);
                if (OVar3 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                  *puVar7 = 1;
                  bVar4 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  pVVar10 = (Value *)CONCAT71(extraout_var_01,bVar4);
                  if (!bVar4) {
LAB_0044c966:
                    pcVar2 = (code *)invalidInstructionException();
                    (*pcVar2)();
                  }
                  *puVar7 = 0;
                }
                if (((StackSym *)this_03[1]._vptr_Opnd)->m_type == TyVar) {
                  return pVVar10;
                }
                pSVar9 = StackSym::GetVarEquivSym((StackSym *)this_03[1]._vptr_Opnd,(Func *)0x0);
                pRVar12 = this_04->currentRegion;
                RVar13 = pRVar12->type;
                if (RVar13 == RegionTypeTry) {
                  BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pRVar12->writeThroughSymbolsSet,(pSVar9->super_Sym).m_id);
                  if (BVar5 != '\0') goto LAB_0044c928;
                  pRVar12 = this_04->currentRegion;
                  RVar13 = pRVar12->type;
                }
                if (RVar13 == RegionTypeFinally) {
                  BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (pRVar12->matchingTryRegion->writeThroughSymbolsSet,
                                     (pSVar9->super_Sym).m_id);
                  pRVar12 = (Region *)CONCAT71(extraout_var_02,BVar5);
                  if (BVar5 != '\0') {
LAB_0044c928:
                    pRVar8 = IR::RegOpnd::New(pSVar9,TyVar,*(Func **)(lVar14 + 0x20));
                    pIVar11 = ToVar(this_04,*(Instr **)(lVar14 + 0x10),pRVar8,this_04->currentBlock,
                                    (Value *)0x0,false);
                    return (Value *)pIVar11;
                  }
                }
              }
              return (Value *)pRVar12;
            }
          }
          BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                            ((this->currentBlock->loop->regAlloc).liveOnBackEdgeSyms,
                             *(BVIndex *)&this_02->intConstantToStackSymMap);
          if ((BVar5 != '\0') &&
             (pVVar10 = GlobOptBlockData::FindValue
                                  (&this->currentBlock->globOptData,&pSVar9->super_Sym),
             pVVar10->valueNumber == pVStack_48->valueNumber)) {
            if (((pRVar8->super_Opnd).field_0xb & 4) == 0) {
              pIVar11 = IR::Instr::GetPrevRealInstrOrLabel(*pInstr);
              if (((pIVar11->m_dst == (Opnd *)0x0) ||
                  (bVar4 = IR::RegOpnd::IsEqualInternal(pRVar8,pIVar11->m_dst), !bVar4)) ||
                 (((pIVar11->m_src1 == (Opnd *)0x0 ||
                   (bVar4 = IR::Opnd::IsEqual(&this_01->super_Opnd,pIVar11->m_src1), !bVar4)) &&
                  ((pIVar11->m_src2 == (Opnd *)0x0 ||
                   (bVar4 = IR::Opnd::IsEqual(&this_01->super_Opnd,pIVar11->m_src2), !bVar4))))))
              goto LAB_0044c669;
            }
            SetSymStoreDirect(this,pVStack_48->valueInfo,(Sym *)this_02);
          }
        }
      }
    }
  }
  else {
    OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar3 == OpndKindReg) {
      OVar3 = IR::Opnd::GetKind((Opnd *)this_00);
      if (OVar3 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar4) {
LAB_0044c7b8:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                (this->rootLoopPrePass->symsDefInLoop,this_00->m_sym->m_id);
    }
  }
LAB_0044c669:
  ValueNumberObjectType(this,(Opnd *)this_00,*pInstr);
LAB_0044c67c:
  pVVar10 = pVStack_48;
  CSEAddInstr(this,this->currentBlock,*pInstr,pVStack_48,src1Val,src2Val,dstIndirIndexVal,
              src1IndirIndexVal);
  return pVVar10;
}

Assistant:

Value*
GlobOpt::OptDst(
    IR::Instr ** pInstr,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    Value *dstIndirIndexVal,
    Value *src1IndirIndexVal)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *opnd = instr->GetDst();

    if (opnd)
    {
        if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
        {
            this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
        }

        if (opnd->IsIndirOpnd() && !this->IsLoopPrePass())
        {
            IR::RegOpnd *baseOpnd = opnd->AsIndirOpnd()->GetBaseOpnd();
            const ValueType baseValueType(baseOpnd->GetValueType());
            if ((
                    baseValueType.IsLikelyNativeArray() ||
                #ifdef _M_IX86
                    (
                        !AutoSystemInfo::Data.SSE2Available() &&
                        baseValueType.IsLikelyObject() &&
                        (
                            baseValueType.GetObjectType() == ObjectType::Float32Array ||
                            baseValueType.GetObjectType() == ObjectType::Float64Array
                        )
                    )
                #else
                    false
                #endif
                ) &&
                instr->GetSrc1()->IsVar())
            {
                if(instr->m_opcode == Js::OpCode::StElemC)
                {
                    // StElemC has different code that handles native array conversion or missing value stores. Add a bailout
                    // for those cases.
                    Assert(baseValueType.IsLikelyNativeArray());
                    Assert(!instr->HasBailOutInfo());
                    GenerateBailAtOperation(&instr, IR::BailOutConventionalNativeArrayAccessOnly);
                }
                else if(instr->HasBailOutInfo())
                {
                    // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
                    // path. Note that the removed bailouts should not be necessary for correctness. Bailout on native array
                    // conversion will be handled automatically as normal.
                    IR::BailOutKind bailOutKind = instr->GetBailOutKind();
                    if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
                    {
                        bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
                    }
                    if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
                    {
                        bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
                    }
                    if(bailOutKind)
                    {
                        instr->SetBailOutKind(bailOutKind);
                    }
                    else
                    {
                        instr->ClearBailOutInfo();
                    }
                }
            }
        }
    }

    this->ProcessKills(instr);

    if (opnd)
    {
        if (dstVal == nullptr)
        {
            dstVal = ValueNumberDst(pInstr, src1Val, src2Val);
        }
        if (this->IsLoopPrePass())
        {
            // Keep track of symbols defined in the loop.
            if (opnd->IsRegOpnd())
            {
                StackSym *symDst = opnd->AsRegOpnd()->m_sym;
                rootLoopPrePass->symsDefInLoop->Set(symDst->m_id);
            }
        }
        else if (dstVal)
        {
            opnd->SetValueType(dstVal->GetValueInfo()->Type());
            if (currentBlock->loop &&
                !IsLoopPrePass() &&
                (instr->m_opcode == Js::OpCode::Ld_A || instr->m_opcode == Js::OpCode::Ld_I4) &&
                instr->GetSrc1()->IsRegOpnd() &&
                !func->IsJitInDebugMode())
            {
                // Look for the following patterns:
                //
                // Pattern 1:
                //     s1[liveOnBackEdge] = s3[dead]
                //
                // Pattern 2:
                //     s3 = operation(s1[liveOnBackEdge], s2)
                //     s1[liveOnBackEdge] = s3
                //
                // In both patterns, s1 and s3 have the same value by the end. Prefer to use s1 as the sym store instead of s3
                // since s1 is live on back-edge, as otherwise, their lifetimes overlap, requiring two registers to hold the
                // value instead of one.
                do
                {
                    IR::RegOpnd *const src = instr->GetSrc1()->AsRegOpnd();
                    StackSym *srcVarSym = src->m_sym;
                    if(srcVarSym->IsTypeSpec())
                    {
                        srcVarSym = srcVarSym->GetVarEquivSym(nullptr);
                        Assert(srcVarSym);
                    }
                    if(dstVal->GetValueInfo()->GetSymStore() != srcVarSym)
                    {
                        break;
                    }

                    IR::RegOpnd *const dst = opnd->AsRegOpnd();
                    StackSym *dstVarSym = dst->m_sym;
                    if(dstVarSym->IsTypeSpec())
                    {
                        dstVarSym = dstVarSym->GetVarEquivSym(nullptr);
                        Assert(dstVarSym);
                    }
                    if(!currentBlock->loop->regAlloc.liveOnBackEdgeSyms->Test(dstVarSym->m_id))
                    {
                        break;
                    }

                    Value *const srcValue = CurrentBlockData()->FindValue(srcVarSym);
                    if(srcValue->GetValueNumber() != dstVal->GetValueNumber())
                    {
                        break;
                    }

                    if(!src->GetIsDead())
                    {
                        IR::Instr *const prevInstr = instr->GetPrevRealInstrOrLabel();
                        IR::Opnd *const prevDst = prevInstr->GetDst();
                        if(!prevDst ||
                            !src->IsEqualInternal(prevDst) ||
                            !(
                                (prevInstr->GetSrc1() && dst->IsEqual(prevInstr->GetSrc1())) ||
                                (prevInstr->GetSrc2() && dst->IsEqual(prevInstr->GetSrc2()))
                            ))
                        {
                            break;
                        }
                    }

                    this->SetSymStoreDirect(dstVal->GetValueInfo(), dstVarSym);
                } while(false);
            }
        }

        this->ValueNumberObjectType(opnd, instr);
    }

    this->CSEAddInstr(this->currentBlock, *pInstr, dstVal, src1Val, src2Val, dstIndirIndexVal, src1IndirIndexVal);

    return dstVal;
}